

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetAttributes
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attributes)

{
  Type *pTVar1;
  int iVar2;
  ScriptContext *pSVar3;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  bool bVar4;
  PropertyId propertyId_00;
  BOOL BVar5;
  BOOL BVar6;
  int iVar7;
  undefined7 in_register_00000009;
  char cVar8;
  Type *pTVar9;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_58;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_50;
  JavascriptLibrary *local_48;
  uint32 local_3c;
  undefined4 local_38;
  uint32 indexVal;
  
  local_38 = (undefined4)CONCAT71(in_register_00000009,attributes);
  iVar2 = this->propertyCount;
  cVar8 = 0 < iVar2;
  if (0 < iVar2) {
    pTVar9 = this->descriptors;
    if ((this->descriptors[0].Id.ptr)->pid != propertyId) {
      iVar7 = 0;
      do {
        if (iVar2 + -1 == iVar7) goto LAB_00e52977;
        pTVar1 = pTVar9 + 1;
        pTVar9 = pTVar9 + 1;
        iVar7 = iVar7 + 1;
      } while (((pTVar1->Id).ptr)->pid != propertyId);
      cVar8 = iVar7 < iVar2;
    }
    if (((pTVar9->field_1).Attributes & 8) == 0) {
      (pTVar9->field_1).Attributes = attributes & 7 | (pTVar9->field_1).Attributes & 0xf0;
      indexVal._3_1_ = cVar8;
      if ((attributes & 1) != 0) {
        DynamicObject::SetHasNoEnumerableProperties(instance,false);
      }
      local_48 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      local_50 = &local_48->typesWithOnlyWritablePropertyProtoChain;
      Memory::Recycler::WBSetBit((char *)&local_58);
      local_58 = local_50;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
      this_00 = local_58;
      cVar8 = indexVal._3_1_;
      if (((pTVar9->field_1).Attributes & 4) == 0) {
        pSVar3 = (local_48->super_JavascriptLibraryBase).scriptContext.ptr;
        DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
        cVar8 = indexVal._3_1_;
        if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
          propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(pSVar3,propertyId);
          ScriptContext::InvalidateStoreFieldCaches(pSVar3,propertyId_00);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
          cVar8 = indexVal._3_1_;
        }
      }
    }
    if (cVar8 != '\0') {
      return 1;
    }
  }
LAB_00e52977:
  pSVar3 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar4 = DynamicObject::HasObjectArray(instance);
  BVar6 = 1;
  if ((bVar4) &&
     (BVar5 = ScriptContext::IsNumericPropertyId(pSVar3,propertyId,&local_3c), BVar5 != 0)) {
    BVar6 = DynamicTypeHandler::SetItemAttributes
                      (&this->super_DynamicTypeHandler,instance,local_3c,
                       (PropertyAttributes)local_38);
  }
  return BVar6;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return true;
                }

                descriptors[i].Attributes = (descriptors[i].Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);
                if (descriptors[i].Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptors[i].Attributes, propertyId, library->GetScriptContext());
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemAttributes(instance, indexVal, attributes);
        }

        return true;
    }